

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O1

bool bssl::ReadUTCOrGeneralizedTime(Parser *parser,GeneralizedTime *out)

{
  bool bVar1;
  GeneralizedTime *in_RCX;
  Input in;
  Input in_00;
  CBS_ASN1_TAG tag;
  Input value;
  CBS_ASN1_TAG local_1c;
  Input local_18;
  
  local_18.data_.data_ = (uchar *)0x0;
  local_18.data_.size_ = 0;
  bVar1 = der::Parser::ReadTagAndValue(parser,&local_1c,&local_18);
  if (bVar1) {
    if (local_1c == 0x18) {
      in_00.data_.size_ = (size_t)out;
      in_00.data_.data_ = (uchar *)local_18.data_.size_;
      bVar1 = der::ParseGeneralizedTime((der *)local_18.data_.data_,in_00,in_RCX);
      return bVar1;
    }
    if (local_1c == 0x17) {
      in.data_.size_ = (size_t)out;
      in.data_.data_ = (uchar *)local_18.data_.size_;
      bVar1 = der::ParseUTCTime((der *)local_18.data_.data_,in,in_RCX);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ReadUTCOrGeneralizedTime(der::Parser *parser, der::GeneralizedTime *out) {
  der::Input value;
  CBS_ASN1_TAG tag;

  if (!parser->ReadTagAndValue(&tag, &value)) {
    return false;
  }

  if (tag == CBS_ASN1_UTCTIME) {
    return der::ParseUTCTime(value, out);
  }

  if (tag == CBS_ASN1_GENERALIZEDTIME) {
    return der::ParseGeneralizedTime(value, out);
  }

  // Unrecognized tag.
  return false;
}